

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O3

Texture * rw::d3d8::readNativeTexture(Stream *stream)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  uint16 uVar4;
  uint32 uVar5;
  int32 iVar6;
  uint height;
  uint depth;
  Texture *pTVar7;
  Raster *pRVar8;
  uint8 *puVar9;
  int iVar10;
  uint numLevels;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  uint format;
  
  bVar1 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (!bVar1) {
    readNativeTexture();
    return (Texture *)0x0;
  }
  uVar5 = Stream::readU32(stream);
  if (uVar5 != 8) {
    readNativeTexture((d3d8 *)(ulong)uVar5);
    return (Texture *)0x0;
  }
  pTVar7 = Texture::create((Raster *)0x0);
  if (pTVar7 == (Texture *)0x0) {
    return (Texture *)0x0;
  }
  uVar5 = Stream::readU32(stream);
  pTVar7->filterAddressing = uVar5;
  iVar11 = 0x20;
  (*stream->_vptr_Stream[4])(stream,pTVar7->name,0x20);
  (*stream->_vptr_Stream[4])(stream,pTVar7->mask,0x20);
  uVar5 = Stream::readU32(stream);
  iVar6 = Stream::readI32(stream);
  uVar4 = Stream::readU16(stream);
  uVar12 = (uint)uVar4;
  uVar4 = Stream::readU16(stream);
  height = (uint)uVar4;
  bVar2 = Stream::readU8(stream);
  depth = (uint)bVar2;
  bVar2 = Stream::readU8(stream);
  numLevels = (uint)bVar2;
  bVar2 = Stream::readU8(stream);
  bVar3 = Stream::readU8(stream);
  if ((uVar5 >> 0xe & 1) == 0) {
    iVar11 = 0x100;
    iVar10 = 0;
    if ((uVar5 >> 0xd & 1) == 0) goto LAB_00114b49;
  }
  iVar10 = iVar11;
  if (d3d::isP8supported == 0) {
    pRVar8 = readAsImage(stream,uVar12,height,depth,uVar5 | bVar2,numLevels);
    pTVar7->raster = pRVar8;
    return pTVar7;
  }
LAB_00114b49:
  format = uVar5 | bVar2;
  if (bVar3 == 0) {
    pRVar8 = Raster::create(uVar12,height,depth,format,8);
    lVar14 = (long)&pRVar8->platform + (long)d3d::nativeRasterOffset;
  }
  else {
    pRVar8 = Raster::create(uVar12,height,depth,format | 0x80,8);
    lVar13 = (long)d3d::nativeRasterOffset;
    lVar14 = (long)&pRVar8->platform + lVar13;
    d3d::allocateDXT(pRVar8,(uint)bVar3,numLevels,iVar6);
    *(undefined1 *)((long)&pRVar8->stride + lVar13 + 1) = 1;
  }
  pTVar7->raster = pRVar8;
  if (iVar10 != 0) {
    (*stream->_vptr_Stream[4])(stream,*(undefined8 *)(lVar14 + 8),(ulong)(uint)(iVar10 << 2));
  }
  if (numLevels != 0) {
    uVar12 = 0;
    do {
      uVar5 = Stream::readU32(stream);
      iVar6 = Raster::getNumLevels(pRVar8);
      if ((int)uVar12 < iVar6) {
        puVar9 = Raster::lock(pRVar8,uVar12,5);
        (*stream->_vptr_Stream[4])(stream,puVar9,(ulong)uVar5);
        Raster::unlock(pRVar8,uVar12);
      }
      else {
        (*stream->_vptr_Stream[5])(stream,(ulong)uVar5,1);
      }
      uVar12 = uVar12 + 1;
    } while (numLevels != uVar12);
    return pTVar7;
  }
  return pTVar7;
}

Assistant:

Texture*
readNativeTexture(Stream *stream)
{
	uint32 platform;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_D3D8){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	Texture *tex = Texture::create(nil);
	if(tex == nil)
		return nil;

	// Texture
	tex->filterAddressing = stream->readU32();
	stream->read8(tex->name, 32);
	stream->read8(tex->mask, 32);

	// Raster
	uint32 format = stream->readU32();
	bool32 hasAlpha = stream->readI32();
	int32 width = stream->readU16();
	int32 height = stream->readU16();
	int32 depth = stream->readU8();
	int32 numLevels = stream->readU8();
	int32 type = stream->readU8();
	int32 compression = stream->readU8();

	int32 pallength = 0;
	if(format & Raster::PAL4 || format & Raster::PAL8){
		pallength = format & Raster::PAL4 ? 32 : 256;
		if(!d3d::isP8supported){
			tex->raster = readAsImage(stream, width, height, depth, format|type, numLevels);
			return tex;
		}
	}

	Raster *raster;
	D3dRaster *ras;
	if(compression){
		raster = Raster::create(width, height, depth, format | type | Raster::DONTALLOCATE, PLATFORM_D3D8);
		ras = GETD3DRASTEREXT(raster);
		allocateDXT(raster, compression, numLevels, hasAlpha);
		ras->customFormat = 1;
	}else{
		raster = Raster::create(width, height, depth, format | type, PLATFORM_D3D8);
		ras = GETD3DRASTEREXT(raster);
	}
	tex->raster = raster;

	// TODO: check if format supported and convert if necessary

	if(pallength != 0)
		stream->read8(ras->palette, 4*pallength);

	uint32 size;
	uint8 *data;
	for(int32 i = 0; i < numLevels; i++){
		size = stream->readU32();
		if(i < raster->getNumLevels()){
			data = raster->lock(i, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
			stream->read8(data, size);
			raster->unlock(i);
		}else
			stream->seek(size);
	}
	return tex;
}